

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O0

MMAL_PARAM_EXPOSUREMETERINGMODE_T __thiscall
raspicam::_private::Private_Impl_Still::convertMetering
          (Private_Impl_Still *this,RASPICAM_METERING metering)

{
  RASPICAM_METERING metering_local;
  Private_Impl_Still *this_local;
  MMAL_PARAM_EXPOSUREMETERINGMODE_T local_4;
  
  switch(metering) {
  case RASPICAM_METERING_AVERAGE:
    local_4 = MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
    break;
  case RASPICAM_METERING_SPOT:
    local_4 = MMAL_PARAM_EXPOSUREMETERINGMODE_SPOT;
    break;
  case RASPICAM_METERING_BACKLIT:
    local_4 = MMAL_PARAM_EXPOSUREMETERINGMODE_BACKLIT;
    break;
  case RASPICAM_METERING_MATRIX:
    local_4 = MMAL_PARAM_EXPOSUREMETERINGMODE_MATRIX;
    break;
  default:
    local_4 = MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
  }
  return local_4;
}

Assistant:

MMAL_PARAM_EXPOSUREMETERINGMODE_T Private_Impl_Still::convertMetering ( RASPICAM_METERING metering ) {
            switch ( metering ) {
            case RASPICAM_METERING_AVERAGE:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
            case RASPICAM_METERING_SPOT:
                return  MMAL_PARAM_EXPOSUREMETERINGMODE_SPOT;
            case RASPICAM_METERING_BACKLIT:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_BACKLIT;
            case RASPICAM_METERING_MATRIX:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_MATRIX;
            default:
                return MMAL_PARAM_EXPOSUREMETERINGMODE_AVERAGE;
            }
        }